

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

string * miniros::network::determineHost_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  sockaddr *__sa;
  Level level;
  void *logger_handle;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  socklen_t __salen;
  string *in_RDI;
  ifaddrs *piVar6;
  allocator<char> local_661;
  string ip_env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  ifaddrs *ifp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  char preferred_ip [200];
  char ip_ [200];
  char host [1024];
  
  paVar1 = &ip_env.field_2;
  ip_env._M_string_length = 0;
  ip_env.field_2._M_local_buf[0] = '\0';
  ip_env._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = get_environment_variable(&ip_env,"ROS_HOSTNAME");
  if (bVar3) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (determineHost::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)ip_,"miniros.unknown_package",(allocator<char> *)&local_640);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     preferred_ip,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ip_,".");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)host,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     preferred_ip,"roscxx");
      console::initializeLogLocation(&determineHost::loc,(string *)host,Debug);
      std::__cxx11::string::~string((string *)host);
      std::__cxx11::string::~string((string *)preferred_ip);
      std::__cxx11::string::~string((string *)ip_);
    }
    if (determineHost::loc.level_ != Debug) {
      console::setLogLocationLevel(&determineHost::loc,Debug);
      console::checkLogLocationEnabled(&determineHost::loc);
    }
    if (determineHost::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,determineHost::loc.logger_,determineHost::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,0x5b,"std::string miniros::network::determineHost()",
                     "determineIP: using value of ROS_HOSTNAME:%s:",ip_env._M_dataplus._M_p);
    }
    if (ip_env._M_string_length == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)host,"miniros.unknown_package",(allocator<char> *)preferred_ip);
        console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)host,Warn);
        std::__cxx11::string::~string((string *)host);
      }
      if (determineHost[abi:cxx11]()::loc.level_ != Warn) {
        console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Warn);
        console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
      }
      if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                       determineHost[abi:cxx11]()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                       ,0x5d,"std::string miniros::network::determineHost()",
                       "invalid ROS_HOSTNAME (an empty string)");
      }
    }
  }
  else {
    bVar3 = get_environment_variable(&ip_env,"ROS_IP");
    if (!bVar3) {
      memset(host,0,0x400);
      iVar4 = gethostname(host,0x3ff);
      if (iVar4 == 0) {
        if ((host[0] != '\0') && (iVar4 = bcmp("localhost",host,10), iVar4 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)in_RDI,host,(allocator<char> *)preferred_ip);
          goto LAB_00233ef5;
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)preferred_ip,"miniros.unknown_package",(allocator<char> *)ip_);
          console::initializeLogLocation
                    (&determineHost[abi:cxx11]()::loc,(string *)preferred_ip,Error);
          std::__cxx11::string::~string((string *)preferred_ip);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Error) {
          console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Error);
          console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
        }
        if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x6f,"std::string miniros::network::determineHost()",
                         "determineIP: gethostname failed");
        }
      }
      piVar6 = (ifaddrs *)&ifp;
      ifp = (ifaddrs *)0x0;
      iVar4 = getifaddrs(piVar6);
      if (iVar4 < 0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)preferred_ip,"miniros.unknown_package",(allocator<char> *)ip_);
          console::initializeLogLocation
                    (&determineHost[abi:cxx11]()::loc,(string *)preferred_ip,Fatal);
          std::__cxx11::string::~string((string *)preferred_ip);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Fatal) {
          console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Fatal);
          console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
        }
        logger_handle = determineHost[abi:cxx11]()::loc.logger_;
        level = determineHost[abi:cxx11]()::loc.level_;
        if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
          pcVar5 = strerror(iVar4);
          console::print((FilterBase *)0x0,logger_handle,level,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x7c,"std::string miniros::network::determineHost()",
                         "error in getifaddrs: [%s]",pcVar5);
        }
      }
      memset(preferred_ip,0,200);
LAB_00233fea:
      do {
        piVar6 = piVar6->ifa_next;
        if (piVar6 == (ifaddrs *)0x0) goto LAB_002341e1;
        __sa = (sockaddr *)piVar6->ifa_addr;
        if (__sa != (sockaddr *)0x0) {
          __salen = 0x10;
          if (__sa->sa_family != 2) {
            if (__sa->sa_family != 10) goto LAB_00233fea;
            __salen = 0x1c;
          }
          iVar4 = getnameinfo(__sa,__salen,ip_,200,(char *)0x0,0,1);
          if (iVar4 < 0) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5f8,"miniros.unknown_package",&local_661);
              std::operator+(&local_620,&local_5f8,".");
              std::operator+(&local_640,&local_620,"roscxx");
              console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,&local_640,Debug);
              std::__cxx11::string::~string((string *)&local_640);
              std::__cxx11::string::~string((string *)&local_620);
              std::__cxx11::string::~string((string *)&local_5f8);
            }
            if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
              console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Debug);
              console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
            }
            if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                             determineHost[abi:cxx11]()::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                             ,0x8c,"std::string miniros::network::determineHost()",
                             "getnameinfo couldn\'t get the ip of interface [%s]",piVar6->ifa_name);
            }
          }
          else {
            iVar4 = bcmp("127.0.0.1",ip_,10);
            if (((iVar4 != 0) &&
                (pcVar5 = strchr(ip_,0x3a), cVar2 = preferred_ip[0], pcVar5 == (char *)0x0)) &&
               (((preferred_ip[0] == '\0' && piVar6->ifa_addr->sa_family == 10 ||
                 (bVar3 = isPrivateIP(ip_), bVar3 && cVar2 == '\0')) ||
                ((!bVar3 && (bVar3 = isPrivateIP(preferred_ip), bVar3 || cVar2 == '\0')))))) {
              strcpy(preferred_ip,ip_);
            }
          }
        }
      } while( true );
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)host,"miniros.unknown_package",(allocator<char> *)preferred_ip);
      console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)host,Debug);
      std::__cxx11::string::~string((string *)host);
    }
    if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
      console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Debug);
      console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
    }
    if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                     determineHost[abi:cxx11]()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,100,"std::string miniros::network::determineHost()",
                     "determineIP: using value of ROS_IP:%s:",ip_env._M_dataplus._M_p);
    }
    if (ip_env._M_string_length == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)host,"miniros.unknown_package",(allocator<char> *)preferred_ip);
        console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)host,Warn);
        std::__cxx11::string::~string((string *)host);
      }
      if (determineHost[abi:cxx11]()::loc.level_ != Warn) {
        console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Warn);
        console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
      }
      if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                       determineHost[abi:cxx11]()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                       ,0x66,"std::string miniros::network::determineHost()",
                       "invalid ROS_IP (an empty string)");
      }
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ip_env._M_dataplus._M_p == paVar1) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(ip_env.field_2._M_allocated_capacity._1_7_,ip_env.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = ip_env.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = ip_env._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(ip_env.field_2._M_allocated_capacity._1_7_,ip_env.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = ip_env._M_string_length;
  ip_env._M_string_length = 0;
  ip_env.field_2._M_local_buf[0] = '\0';
  ip_env._M_dataplus._M_p = (pointer)paVar1;
  goto LAB_00233ef5;
LAB_002341e1:
  freeifaddrs();
  if (preferred_ip[0] == '\0') {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_620,"miniros.unknown_package",(allocator<char> *)&local_5f8);
      std::operator+(&local_640,&local_620,".");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ip_,
                     &local_640,"roscxx");
      console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)ip_,Error);
      std::__cxx11::string::~string((string *)ip_);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_620);
    }
    if (determineHost[abi:cxx11]()::loc.level_ != Error) {
      console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Error);
      console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
    }
    if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                     determineHost[abi:cxx11]()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,0x9f,"std::string miniros::network::determineHost()",
                     "Couldn\'t find a preferred IP via the getifaddrs() call; I\'m assuming that your IP address is 127.0.0.1.  This should work for local processes, but will almost certainly not work if you have remote processes.Report to the ROS development team to seek a fix."
                    );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"127.0.0.1",(allocator<char> *)ip_);
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_620,"miniros.unknown_package",(allocator<char> *)&local_5f8);
      std::operator+(&local_640,&local_620,".");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ip_,
                     &local_640,"roscxx");
      console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)ip_,Debug);
      std::__cxx11::string::~string((string *)ip_);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_620);
    }
    if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
      console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Debug);
      console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
    }
    if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                     determineHost[abi:cxx11]()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,0xa2,"std::string miniros::network::determineHost()",
                     "preferred IP is guessed to be %s",preferred_ip);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,preferred_ip,(allocator<char> *)ip_);
  }
LAB_00233ef5:
  std::__cxx11::string::~string((string *)&ip_env);
  return in_RDI;
}

Assistant:

std::string determineHost()
{
  std::string ip_env;
  // First, did the user set ROS_HOSTNAME?
  if (get_environment_variable(ip_env, "ROS_HOSTNAME")) {
    MINIROS_DEBUG_NAMED("roscxx", "determineIP: using value of ROS_HOSTNAME:%s:", ip_env.c_str());
    if (ip_env.size() == 0) {
      MINIROS_WARN("invalid ROS_HOSTNAME (an empty string)");
    }
    return ip_env;
  }

  // Second, did the user set ROS_IP?
  if (get_environment_variable(ip_env, "ROS_IP")) {
    MINIROS_DEBUG("determineIP: using value of ROS_IP:%s:", ip_env.c_str());
    if (ip_env.size() == 0) {
      MINIROS_WARN("invalid ROS_IP (an empty string)");
    }
    return ip_env;
  }

  // Third, try the hostname
  char host[1024];
  memset(host, 0, sizeof(host));
  if (gethostname(host, sizeof(host) - 1) != 0) {
    MINIROS_ERROR("determineIP: gethostname failed");
  }
  // We don't want localhost to be our ip
  else if (strlen(host) && strcmp("localhost", host)) {
    return std::string(host);
  }

  // Fourth, fall back on interface search, which will yield an IP address

#ifdef HAVE_IFADDRS_H
  struct ifaddrs *ifa = NULL, *ifp = NULL;
  int rc;
  if ((rc = getifaddrs(&ifp)) < 0) {
    MINIROS_FATAL("error in getifaddrs: [%s]", strerror(rc));
    MINIROS_BREAK();
  }
  char preferred_ip[200] = {0};
  for (ifa = ifp; ifa; ifa = ifa->ifa_next) {
    char ip_[200];
    socklen_t salen;
    if (!ifa->ifa_addr)
      continue; // evidently this interface has no ip address
    if (ifa->ifa_addr->sa_family == AF_INET)
      salen = sizeof(struct sockaddr_in);
    else if (ifa->ifa_addr->sa_family == AF_INET6)
      salen = sizeof(struct sockaddr_in6);
    else
      continue;
    if (getnameinfo(ifa->ifa_addr, salen, ip_, sizeof(ip_), NULL, 0, NI_NUMERICHOST) < 0) {
      MINIROS_DEBUG_NAMED("roscxx", "getnameinfo couldn't get the ip of interface [%s]", ifa->ifa_name);
      continue;
    }
    // ROS_INFO( "ip of interface [%s] is [%s]", ifa->ifa_name, ip);
    //  prefer non-private IPs over private IPs
    if (!strcmp("127.0.0.1", ip_) || strchr(ip_, ':'))
      continue; // ignore loopback unless we have no other choice
    if (ifa->ifa_addr->sa_family == AF_INET6 && !preferred_ip[0])
      strcpy(preferred_ip, ip_);
    else if (isPrivateIP(ip_) && !preferred_ip[0])
      strcpy(preferred_ip, ip_);
    else if (!isPrivateIP(ip_) && (isPrivateIP(preferred_ip) || !preferred_ip[0]))
      strcpy(preferred_ip, ip_);
  }
  freeifaddrs(ifp);
  if (!preferred_ip[0]) {
    MINIROS_ERROR_NAMED("roscxx", "Couldn't find a preferred IP via the getifaddrs() call; I'm assuming that your IP "
                                  "address is 127.0.0.1.  This should work for local processes, "
                                  "but will almost certainly not work if you have remote processes."
                                  "Report to the ROS development team to seek a fix.");
    return std::string("127.0.0.1");
  }
  MINIROS_DEBUG_NAMED("roscxx", "preferred IP is guessed to be %s", preferred_ip);
  return std::string(preferred_ip);
#else
  // @todo Fix IP determination in the case where getifaddrs() isn't
  // available.
  MINIROS_ERROR("You don't have the getifaddrs() call; I'm assuming that your IP "
                "address is 127.0.0.1.  This should work for local processes, "
                "but will almost certainly not work if you have remote processes."
                "Report to the ROS development team to seek a fix.");
  return std::string("127.0.0.1");
#endif
}